

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::EnumMember
          (GoGenerator *this,EnumDef *enum_def,EnumVal *ev,size_t max_name_length,string *code_ptr)

{
  string *psVar1;
  long lVar2;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88 [48];
  string local_58;
  string *local_38;
  string *code;
  string *code_ptr_local;
  size_t max_name_length_local;
  EnumVal *ev_local;
  EnumDef *enum_def_local;
  GoGenerator *this_local;
  
  local_38 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)max_name_length;
  max_name_length_local = (size_t)ev;
  ev_local = (EnumVal *)enum_def;
  enum_def_local = (EnumDef *)this;
  std::__cxx11::string::operator+=((string *)code_ptr,"\t");
  IdlNamer::EnumVariant_abi_cxx11_
            (&local_58,&this->namer_,(EnumDef *)ev_local,(EnumVal *)max_name_length_local);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::operator+=((string *)local_38," ");
  psVar1 = code_ptr_local;
  lVar2 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,(long)psVar1 - lVar2,' ',&local_89);
  std::__cxx11::string::operator+=((string *)local_38,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  GetEnumTypeName_abi_cxx11_(&local_b0,this,(EnumDef *)ev_local);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::operator+=((string *)local_38," = ");
  EnumDef::ToString_abi_cxx11_(&local_f0,(EnumDef *)ev_local,(EnumVal *)max_name_length_local);
  std::operator+(&local_d0,&local_f0,"\n");
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void EnumMember(const EnumDef &enum_def, const EnumVal &ev,
                  size_t max_name_length, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\t";
    code += namer_.EnumVariant(enum_def, ev);
    code += " ";
    code += std::string(max_name_length - ev.name.length(), ' ');
    code += GetEnumTypeName(enum_def);
    code += " = ";
    code += enum_def.ToString(ev) + "\n";
  }